

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O0

void __thiscall
duckdb_tdigest::TDigest::TDigest
          (TDigest *this,Value compression,Index unmergedSize,Index mergedSize)

{
  Index IVar1;
  vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_> *in_RDX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  Value in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffd8;
  
  *in_RDI = in_XMM0_Qa;
  dVar2 = std::numeric_limits<double>::max();
  in_RDI[1] = dVar2;
  dVar2 = std::numeric_limits<double>::min();
  in_RDI[2] = dVar2;
  IVar1 = processedSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[3] = IVar1;
  IVar1 = unprocessedSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[4] = IVar1;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::vector
            ((vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_> *)0x9d672e
            );
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::vector
            ((vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_> *)0x9d6741
            );
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9d6754);
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::reserve
            (in_RDX,in_stack_ffffffffffffffd8);
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::reserve
            (in_RDX,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TDigest(Value compression, Index unmergedSize, Index mergedSize)
	    : compression_(compression), maxProcessed_(processedSize(mergedSize, compression)),
	      maxUnprocessed_(unprocessedSize(unmergedSize, compression)) {
		processed_.reserve(maxProcessed_);
		unprocessed_.reserve(maxUnprocessed_ + 1);
	}